

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool GlobOpt::DoFloatTypeSpec(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  BOOL BVar2;
  JITTimeFunctionBody *pJVar3;
  FunctionJITTimeInfo *this;
  JITTimeProfileInfo *this_00;
  
  pJVar3 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar3);
  this = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,FloatTypeSpecPhase,sourceContextId,functionId);
  if ((!bVar1) && (bVar1 = IsTypeSpecPhaseOff(func), !bVar1)) {
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar3);
    if (bVar1) {
      pJVar3 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar3);
      bVar1 = JITTimeProfileInfo::IsFloatTypeSpecDisabled(this_00);
      if (bVar1) {
        return false;
      }
    }
    BVar2 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
    return BVar2 != 0;
  }
  return false;
}

Assistant:

bool
GlobOpt::DoFloatTypeSpec(Func const * func)
{
    return
        !PHASE_OFF(Js::FloatTypeSpecPhase, func) &&
        !IsTypeSpecPhaseOff(func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsFloatTypeSpecDisabled()) &&
        AutoSystemInfo::Data.SSE2Available();
}